

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O1

void __thiscall HighsOptionsStruct::~HighsOptionsStruct(HighsOptionsStruct *this)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *pfVar1;
  _Manager_type p_Var2;
  pointer pcVar3;
  
  this->_vptr_HighsOptionsStruct = (_func_int **)&PTR__HighsOptionsStruct_00159548;
  p_Var2 = (this->log_options).user_callback.super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    pfVar1 = &(this->log_options).user_callback;
    (*p_Var2)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  pcVar3 = (this->mip_improving_solution_file)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->mip_improving_solution_file).field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->icrash_strategy)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->icrash_strategy).field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->write_presolved_model_file)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->write_presolved_model_file).field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->log_file)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->log_file).field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->ranging)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->ranging).field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->write_model_file)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->write_model_file).field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->solution_file)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->solution_file).field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->run_crossover)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->run_crossover).field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->parallel)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->parallel).field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->solver)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->solver).field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->presolve)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->presolve).field_2) {
    operator_delete(pcVar3);
    return;
  }
  return;
}

Assistant:

virtual ~HighsOptionsStruct() {}